

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void Database::create(string *fname)

{
  bool bVar1;
  runtime_error *this;
  Database empty;
  ExclusiveFile lock;
  Database *in_stack_00000490;
  string *in_stack_fffffffffffffe98;
  Database *this_00;
  
  this_00 = (Database *)&stack0xfffffffffffffff4;
  ExclusiveFile::ExclusiveFile((ExclusiveFile *)this_00,in_stack_fffffffffffffe98);
  bVar1 = ExclusiveFile::is_ok((ExclusiveFile *)this_00);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"File already exists");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Database((Database *)empty.iterators._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (string *)empty.iterators._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
           empty.iterators._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_);
  save(in_stack_00000490);
  ~Database(this_00);
  ExclusiveFile::~ExclusiveFile((ExclusiveFile *)this_00);
  return;
}

Assistant:

void Database::create(const std::string &fname) {
    ExclusiveFile lock(fname);
    if (!lock.is_ok()) {
        throw std::runtime_error("File already exists");
    }
    Database empty(fname, false);
    empty.save();
}